

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

int Extra_ThreshSelectWeights6(word *t,int nVars,int *pW)

{
  int Cost;
  int iVar1;
  int iVar2;
  int Cost_1;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar5 = 1 << ((byte)nVars & 0x1f);
  if (nVars != 6) {
    __assert_fail("nVars == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddThresh.c"
                  ,0xf3,"int Extra_ThreshSelectWeights6(word *, int, int *)");
  }
  pW[5] = 1;
  iVar6 = 1;
  do {
    pW[4] = iVar6;
    iVar7 = iVar6;
    do {
      pW[3] = iVar7;
      iVar8 = iVar7;
      do {
        pW[2] = iVar8;
        iVar9 = iVar8;
        do {
          pW[1] = iVar9;
          iVar2 = iVar9;
          do {
            *pW = iVar2;
            iVar11 = iVar2;
            do {
              iVar1 = 10000;
              uVar13 = 0;
              bVar14 = true;
              iVar3 = 0;
              do {
                uVar12 = (uint)uVar13;
                if ((t[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
                  lVar4 = 0;
                  iVar10 = 0;
                  do {
                    if ((uVar12 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
                      iVar10 = iVar10 + pW[lVar4];
                    }
                    lVar4 = lVar4 + 1;
                  } while (lVar4 != 6);
                  if (iVar3 <= iVar10) {
                    iVar3 = iVar10;
                  }
                }
                else {
                  lVar4 = 0;
                  iVar10 = 0;
                  do {
                    if ((uVar12 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
                      iVar10 = iVar10 + pW[lVar4];
                    }
                    lVar4 = lVar4 + 1;
                  } while (lVar4 != 6);
                  if (iVar10 <= iVar1) {
                    iVar1 = iVar10;
                  }
                }
                if (iVar1 <= iVar3) break;
                uVar12 = uVar12 + 1;
                uVar13 = (ulong)uVar12;
                bVar14 = (int)uVar12 < (int)uVar5;
              } while (uVar12 != uVar5);
              if (!bVar14) {
                if (iVar3 < iVar1) {
                  return iVar1;
                }
                __assert_fail("Lmax < Lmin",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddThresh.c"
                              ,0x10a,"int Extra_ThreshSelectWeights6(word *, int, int *)");
              }
              *pW = iVar11 + 1;
              bVar14 = iVar11 < 9;
              iVar11 = iVar11 + 1;
            } while (bVar14);
            pW[1] = iVar2 + 1;
            bVar14 = iVar2 < 9;
            iVar2 = iVar2 + 1;
          } while (bVar14);
          pW[2] = iVar9 + 1;
          bVar14 = iVar9 < 9;
          iVar9 = iVar9 + 1;
        } while (bVar14);
        pW[3] = iVar8 + 1;
        bVar14 = iVar8 < 9;
        iVar8 = iVar8 + 1;
      } while (bVar14);
      pW[4] = iVar7 + 1;
      bVar14 = iVar7 < 9;
      iVar7 = iVar7 + 1;
    } while (bVar14);
    pW[5] = iVar6 + 1;
    bVar14 = iVar6 == 9;
    iVar6 = iVar6 + 1;
    if (bVar14) {
      return 0;
    }
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights6(word * t, int nVars, int * pW) {
	int m, Lmin, Lmax, nMints = (1 << nVars), Limit = nVars + 3;
	assert(nVars == 6);
	for (pW[5] = 1; pW[5] <= Limit; pW[5]++)
		for (pW[4] = pW[5]; pW[4] <= Limit; pW[4]++)
			for (pW[3] = pW[4]; pW[3] <= Limit; pW[3]++)
				for (pW[2] = pW[3]; pW[2] <= Limit; pW[2]++)
					for (pW[1] = pW[2]; pW[1] <= Limit; pW[1]++)
						for (pW[0] = pW[1]; pW[0] <= Limit; pW[0]++) {
							Lmin = 10000;
							Lmax = 0;
							for (m = 0; m < nMints; m++) {
								if (Abc_TtGetBit(t, m))
									Lmin = Abc_MinInt(Lmin,
											Extra_ThreshWeightedSum(pW, nVars,
													m));
								else
									Lmax = Abc_MaxInt(Lmax,
											Extra_ThreshWeightedSum(pW, nVars,
													m));
								if (Lmax >= Lmin)
									break;
							}
							if (m < nMints)
								continue;
							assert(Lmax < Lmin);
							return Lmin;
						}
	return 0;
}